

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O2

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::SimpleBufferedData::Scan(SimpleBufferedData *this)

{
  element_type *peVar1;
  _func_int **pp_Var2;
  bool bVar3;
  pointer this_00;
  idx_t iVar4;
  BufferedData *in_RSI;
  
  bVar3 = BufferedData::Closed(in_RSI);
  if (bVar3) {
    (this->super_BufferedData)._vptr_BufferedData = (_func_int **)0x0;
  }
  else {
    ::std::mutex::lock(&in_RSI->glock);
    peVar1 = in_RSI[2].context.internal.
             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (*(element_type **)((long)&in_RSI[2].glock.super___mutex_base._M_mutex + 8) == peVar1) {
      ::std::__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> *)&in_RSI->context);
      (this->super_BufferedData)._vptr_BufferedData = (_func_int **)0x0;
    }
    else {
      pp_Var2 = *(_func_int ***)
                 &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>;
      (this->super_BufferedData)._vptr_BufferedData = pp_Var2;
      (peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
      ::std::
      deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
      ::pop_front((deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                   *)(in_RSI + 2));
      if (pp_Var2 != (_func_int **)0x0) {
        this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                              *)this);
        iVar4 = DataChunk::GetAllocationSize(this_00);
        LOCK();
        in_RSI[3]._vptr_BufferedData = (_func_int **)((long)in_RSI[3]._vptr_BufferedData - iVar4);
        UNLOCK();
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->glock);
  }
  return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
}

Assistant:

unique_ptr<DataChunk> SimpleBufferedData::Scan() {
	if (Closed()) {
		return nullptr;
	}

	lock_guard<mutex> lock(glock);
	if (buffered_chunks.empty()) {
		Close();
		return nullptr;
	}
	auto chunk = std::move(buffered_chunks.front());
	buffered_chunks.pop();

	if (chunk) {
		auto allocation_size = chunk->GetAllocationSize();
		buffered_count -= allocation_size;
	}
	return chunk;
}